

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log.cc
# Opt level: O0

LoadStatus __thiscall BuildLog::Load(BuildLog *this,string *path,string *err)

{
  Metrics *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int *piVar5;
  undefined1 *puVar6;
  void *pvVar7;
  pointer ppVar8;
  _Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true> this_01;
  ulonglong uVar9;
  uint64_t uVar10;
  char *str;
  size_t extraout_RDX;
  pair<std::__detail::_Node_iterator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_false,_true>,_bool>
  pVar11;
  StringPiece command;
  Metric *pMStack_401a0;
  int kCompactionRatio;
  int kMinCompactionEntryCount;
  char *pcStack_40168;
  char cStack_40159;
  _Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true> _Stack_40158;
  char c;
  undefined1 uStack_40150;
  pair<const_StringPiece,_BuildLog::LogEntry_*> pStack_40148;
  _Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true> _Stack_40130;
  StringPiece SStack_40128;
  _Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true> _Stack_40118;
  iterator i;
  LogEntry *entry;
  undefined1 auStack_40100 [8];
  string output;
  TimeStamp restat_mtime;
  int end_time;
  int start_time;
  char *end;
  char *start;
  char *pcStack_400b8;
  char kFieldSeparator;
  char *line_end;
  char *line_start;
  LineReader reader;
  int total_entry_count;
  int unique_entry_count;
  int log_version;
  FILE *file;
  ScopedMetric metrics_h_scoped;
  bool local_4a;
  allocator<char> local_49;
  string local_48;
  string *local_28;
  string *err_local;
  string *path_local;
  BuildLog *this_local;
  
  local_28 = err;
  err_local = path;
  path_local = (string *)this;
  if ((Load(std::__cxx11::string_const&,std::__cxx11::string*)::metrics_h_metric == '\0') &&
     (iVar2 = __cxa_guard_acquire(&Load(std::__cxx11::string_const&,std::__cxx11::string*)::
                                   metrics_h_metric), this_00 = g_metrics, iVar2 != 0)) {
    metrics_h_scoped.start_._3_1_ = 0;
    local_4a = g_metrics == (Metrics *)0x0;
    if (local_4a) {
      pMStack_401a0 = (Metric *)0x0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,".ninja_log load",&local_49);
      metrics_h_scoped.start_._3_1_ = 1;
      pMStack_401a0 = Metrics::NewMetric(this_00,&local_48);
    }
    local_4a = !local_4a;
    if ((metrics_h_scoped.start_._3_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_48);
    }
    if (local_4a) {
      std::allocator<char>::~allocator(&local_49);
    }
    Load::metrics_h_metric = pMStack_401a0;
    __cxa_guard_release(&Load(std::__cxx11::string_const&,std::__cxx11::string*)::metrics_h_metric);
  }
  ScopedMetric::ScopedMetric((ScopedMetric *)&file,Load::metrics_h_metric);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  _log_version = fopen(pcVar4,"r");
  if (_log_version == (FILE *)0x0) {
    piVar5 = __errno_location();
    if (*piVar5 == 2) {
      this_local._4_4_ = LOAD_NOT_FOUND;
    }
    else {
      piVar5 = __errno_location();
      pcVar4 = strerror(*piVar5);
      std::__cxx11::string::operator=((string *)local_28,pcVar4);
      this_local._4_4_ = LOAD_ERROR;
    }
  }
  else {
    total_entry_count = 0;
    reader.line_end_._4_4_ = 0;
    reader.line_end_._0_4_ = 0;
    LineReader::LineReader((LineReader *)&line_start,(FILE *)_log_version);
    line_end = (char *)0x0;
    pcStack_400b8 = (char *)0x0;
    while (bVar1 = LineReader::ReadLine
                             ((LineReader *)&line_start,&line_end,&stack0xfffffffffffbff48), bVar1)
    {
      if ((total_entry_count == 0) &&
         (__isoc99_sscanf(line_end,"# ninja log v%d\n",&total_entry_count), total_entry_count < 4))
      {
        std::__cxx11::string::operator=
                  ((string *)local_28,
                   "build log version invalid, perhaps due to being too old; starting over");
        fclose(_log_version);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        unlink(pcVar4);
        this_local._4_4_ = LOAD_SUCCESS;
        goto LAB_00108196;
      }
      pcVar4 = line_end;
      if ((pcStack_400b8 != (char *)0x0) &&
         (puVar6 = (undefined1 *)memchr(line_end,9,(long)pcStack_400b8 - (long)line_end),
         puVar6 != (undefined1 *)0x0)) {
        *puVar6 = 0;
        output.field_2._8_8_ = 0;
        iVar2 = atoi(pcVar4);
        pcVar4 = puVar6 + 1;
        puVar6 = (undefined1 *)memchr(pcVar4,9,(long)pcStack_400b8 - (long)pcVar4);
        if (puVar6 != (undefined1 *)0x0) {
          *puVar6 = 0;
          iVar3 = atoi(pcVar4);
          pcVar4 = puVar6 + 1;
          puVar6 = (undefined1 *)memchr(pcVar4,9,(long)pcStack_400b8 - (long)pcVar4);
          if (puVar6 != (undefined1 *)0x0) {
            *puVar6 = 0;
            output.field_2._8_8_ = strtoll(pcVar4,(char **)0x0,10);
            pcVar4 = puVar6 + 1;
            pvVar7 = memchr(pcVar4,9,(long)pcStack_400b8 - (long)pcVar4);
            if (pvVar7 != (void *)0x0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)auStack_40100,pcVar4,(long)pvVar7 - (long)pcVar4,
                         (allocator *)((long)&entry + 7));
              std::allocator<char>::~allocator((allocator<char> *)((long)&entry + 7));
              pcVar4 = pcStack_400b8;
              str = (char *)((long)pvVar7 + 1);
              StringPiece::StringPiece(&SStack_40128,(string *)auStack_40100);
              _Stack_40118._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<StringPiece,_BuildLog::LogEntry_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>_>
                   ::find(&this->entries_,&SStack_40128);
              _Stack_40130._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<StringPiece,_BuildLog::LogEntry_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>_>
                   ::end(&this->entries_);
              bVar1 = std::__detail::operator!=(&_Stack_40118,&_Stack_40130);
              if (bVar1) {
                ppVar8 = std::__detail::
                         _Node_iterator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_false,_true>
                         ::operator->((_Node_iterator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_false,_true>
                                       *)&_Stack_40118);
                i.
                super__Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>.
                _M_cur = (_Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>
                          )ppVar8->second;
              }
              else {
                this_01._M_cur = (__node_type *)operator_new(0x38);
                LogEntry::LogEntry((LogEntry *)this_01._M_cur,(string *)auStack_40100);
                i.
                super__Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>.
                _M_cur = (_Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>
                          )(_Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>
                            )this_01._M_cur;
                std::pair<const_StringPiece,_BuildLog::LogEntry_*>::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_BuildLog::LogEntry_*&,_true>
                          (&pStack_40148,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           this_01._M_cur,(LogEntry **)&i);
                pVar11 = std::
                         unordered_map<StringPiece,_BuildLog::LogEntry_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>_>
                         ::insert(&this->entries_,&pStack_40148);
                _Stack_40158._M_cur =
                     (__node_type *)
                     pVar11.first.
                     super__Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>
                     ._M_cur;
                uStack_40150 = pVar11.second;
                reader.line_end_._4_4_ = reader.line_end_._4_4_ + 1;
              }
              reader.line_end_._0_4_ = (int)reader.line_end_ + 1;
              *(int *)((long)i.
                             super__Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>
                             ._M_cur + 0x28) = iVar2;
              *(int *)((long)i.
                             super__Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>
                             ._M_cur + 0x2c) = iVar3;
              *(undefined8 *)
               ((long)i.
                      super__Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>
                      ._M_cur + 0x30) = output.field_2._8_8_;
              if (total_entry_count < 5) {
                StringPiece::StringPiece
                          ((StringPiece *)&kCompactionRatio,str,(long)pcVar4 - (long)str);
                command.len_ = extraout_RDX;
                command.str_ = pcStack_40168;
                uVar10 = LogEntry::HashCommand(_kCompactionRatio,command);
                *(uint64_t *)
                 ((long)i.
                        super__Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>
                        ._M_cur + 0x20) = uVar10;
              }
              else {
                cStack_40159 = *pcVar4;
                *pcVar4 = '\0';
                uVar9 = strtoull(str,(char **)0x0,0x10);
                *(ulonglong *)
                 ((long)i.
                        super__Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>
                        ._M_cur + 0x20) = uVar9;
                *pcVar4 = cStack_40159;
              }
              std::__cxx11::string::~string((string *)auStack_40100);
            }
          }
        }
      }
    }
    fclose(_log_version);
    if (line_end == (char *)0x0) {
      this_local._4_4_ = LOAD_SUCCESS;
    }
    else {
      if (total_entry_count < 5) {
        this->needs_recompaction_ = true;
      }
      else if ((100 < (int)reader.line_end_) && (reader.line_end_._4_4_ * 3 < (int)reader.line_end_)
              ) {
        this->needs_recompaction_ = true;
      }
      this_local._4_4_ = LOAD_SUCCESS;
    }
  }
LAB_00108196:
  unique_entry_count = 1;
  ScopedMetric::~ScopedMetric((ScopedMetric *)&file);
  return this_local._4_4_;
}

Assistant:

LoadStatus BuildLog::Load(const string& path, string* err) {
  METRIC_RECORD(".ninja_log load");
  FILE* file = fopen(path.c_str(), "r");
  if (!file) {
    if (errno == ENOENT)
      return LOAD_NOT_FOUND;
    *err = strerror(errno);
    return LOAD_ERROR;
  }

  int log_version = 0;
  int unique_entry_count = 0;
  int total_entry_count = 0;

  LineReader reader(file);
  char* line_start = 0;
  char* line_end = 0;
  while (reader.ReadLine(&line_start, &line_end)) {
    if (!log_version) {
      sscanf(line_start, kFileSignature, &log_version);

      if (log_version < kOldestSupportedVersion) {
        *err = ("build log version invalid, perhaps due to being too old; "
                "starting over");
        fclose(file);
        unlink(path.c_str());
        // Don't report this as a failure.  An empty build log will cause
        // us to rebuild the outputs anyway.
        return LOAD_SUCCESS;
      }
    }

    // If no newline was found in this chunk, read the next.
    if (!line_end)
      continue;

    const char kFieldSeparator = '\t';

    char* start = line_start;
    char* end = (char*)memchr(start, kFieldSeparator, line_end - start);
    if (!end)
      continue;
    *end = 0;

    int start_time = 0, end_time = 0;
    TimeStamp restat_mtime = 0;

    start_time = atoi(start);
    start = end + 1;

    end = (char*)memchr(start, kFieldSeparator, line_end - start);
    if (!end)
      continue;
    *end = 0;
    end_time = atoi(start);
    start = end + 1;

    end = (char*)memchr(start, kFieldSeparator, line_end - start);
    if (!end)
      continue;
    *end = 0;
    restat_mtime = strtoll(start, NULL, 10);
    start = end + 1;

    end = (char*)memchr(start, kFieldSeparator, line_end - start);
    if (!end)
      continue;
    string output = string(start, end - start);

    start = end + 1;
    end = line_end;

    LogEntry* entry;
    Entries::iterator i = entries_.find(output);
    if (i != entries_.end()) {
      entry = i->second;
    } else {
      entry = new LogEntry(output);
      entries_.insert(Entries::value_type(entry->output, entry));
      ++unique_entry_count;
    }
    ++total_entry_count;

    entry->start_time = start_time;
    entry->end_time = end_time;
    entry->mtime = restat_mtime;
    if (log_version >= 5) {
      char c = *end; *end = '\0';
      entry->command_hash = (uint64_t)strtoull(start, NULL, 16);
      *end = c;
    } else {
      entry->command_hash = LogEntry::HashCommand(StringPiece(start,
                                                              end - start));
    }
  }
  fclose(file);

  if (!line_start) {
    return LOAD_SUCCESS; // file was empty
  }

  // Decide whether it's time to rebuild the log:
  // - if we're upgrading versions
  // - if it's getting large
  int kMinCompactionEntryCount = 100;
  int kCompactionRatio = 3;
  if (log_version < kCurrentVersion) {
    needs_recompaction_ = true;
  } else if (total_entry_count > kMinCompactionEntryCount &&
             total_entry_count > unique_entry_count * kCompactionRatio) {
    needs_recompaction_ = true;
  }

  return LOAD_SUCCESS;
}